

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidyParseFile(TidyDoc tdoc,ctmbstr filnam)

{
  int iVar1;
  FILE *__stream;
  StreamIn *in;
  uint code;
  stat sbuf;
  
  memset(&sbuf,0,0x90);
  iVar1 = stat(filnam,(stat *)&sbuf);
  if ((iVar1 == 0) && ((sbuf.st_mode._1_1_ & 0x40) == 0)) {
    __stream = fopen(filnam,"rb");
    *(undefined8 *)(tdoc + 0xd1e) = 0;
    *(undefined8 *)(tdoc + 0xd20) = 0;
    if (__stream != (FILE *)0x0) {
      if (tdoc[0x70]._opaque != 0) {
        iVar1 = fileno(__stream);
        iVar1 = fstat(iVar1,(stat *)&sbuf);
        if (iVar1 != -1) {
          *(__time_t *)(tdoc + 0xd1e) = sbuf.st_atim.tv_sec;
          *(__time_t *)(tdoc + 0xd20) = sbuf.st_mtim.tv_sec;
        }
      }
      in = prvTidyFileInput((TidyDocImpl *)tdoc,(FILE *)__stream,tdoc[0x60]._opaque);
      if (in == (StreamIn *)0x0) {
        fclose(__stream);
        return -2;
      }
      iVar1 = prvTidyDocParseStream((TidyDocImpl *)tdoc,in);
      prvTidyfreeFileSource(&in->source,yes);
      prvTidyfreeStreamIn(in);
      return iVar1;
    }
    code = 0x23d;
  }
  else {
    code = 0x23f;
  }
  prvTidyReportFileError((TidyDocImpl *)tdoc,filnam,code);
  return -2;
}

Assistant:

int TIDY_CALL  tidyParseFile( TidyDoc tdoc, ctmbstr filnam )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocParseFile( doc, filnam );
}